

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

bool QPDFPageObjectHelper::removeUnreferencedResourcesHelper
               (QPDFPageObjectHelper *ph,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *unresolved)

{
  BaseHandle *pBVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pQVar3;
  bool bVar4;
  bool bVar5;
  QPDF *this;
  size_t sVar6;
  size_t sVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *__x;
  mapped_type *pmVar8;
  size_type sVar9;
  _Base_ptr p_Var10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *name;
  long lVar11;
  pointer value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i1;
  pointer pbVar12;
  pointer this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1e9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_unresolved;
  QPDFObjectHandle resources;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> rdicts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  to_filter;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  known_names;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  names_by_rtype;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  ResourceFinder rf;
  
  pBVar1 = &(ph->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rf,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  bVar4 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&rf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rf.last_name);
  ResourceFinder::ResourceFinder(&rf);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_unresolved,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  this = QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)&local_unresolved);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_unresolved._M_t._M_impl.super__Rb_tree_header);
  if (this == (QPDF *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = QPDF::numWarnings(this);
  }
  parseContents(ph,&rf.super_ParserCallbacks);
  if (this != (QPDF *)0x0) {
    sVar7 = QPDF::numWarnings(this);
    if (sVar6 < sVar7) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&known_names,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_unresolved,
                 "Bad token found while scanning content stream; not attempting to remove unreferenced objects from this object"
                 ,(allocator<char> *)&names_by_rtype);
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&known_names,(string *)&local_unresolved)
      ;
      std::__cxx11::string::~string((string *)&local_unresolved);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &known_names._M_t._M_impl.super__Rb_tree_header);
      bVar4 = false;
      goto LAB_001a7a81;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_unresolved,"/Resources",(allocator<char> *)&known_names);
  getAttribute((QPDFPageObjectHelper *)&resources,(string *)ph,SUB81(&local_unresolved,0));
  std::__cxx11::string::~string((string *)&local_unresolved);
  rdicts.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rdicts.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rdicts.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  known_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &known_names._M_t._M_impl.super__Rb_tree_header._M_header;
  known_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  known_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  known_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  known_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       known_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_unresolved,"/Font",(allocator<char> *)&names_by_rtype);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             "/XObject",(allocator<char> *)&local_f0);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_unresolved;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&to_filter,__l,&local_1e9);
  lVar11 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&local_unresolved._M_t._M_impl.field_0x0 + lVar11));
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x20);
  bVar5 = QPDFObjectHandle::isDictionary(&resources);
  pbVar12 = to_filter.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar5) {
    for (value = to_filter.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; value != pbVar12; value = value + 1) {
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&names_by_rtype,(string *)&resources);
      bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&names_by_rtype);
      if (bVar5) {
        QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&local_f0);
        QPDFObjectHandle::replaceKeyAndGetNew
                  ((QPDFObjectHandle *)&local_unresolved,(string *)&resources,
                   (QPDFObjectHandle *)value);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&names_by_rtype,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_unresolved);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_unresolved._M_t._M_impl.super__Rb_tree_header);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_f0._M_impl.super__Rb_tree_header);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                  (&rdicts,(value_type *)&names_by_rtype);
        QPDFObjectHandle::getKeys_abi_cxx11_(&local_unresolved,(QPDFObjectHandle *)&names_by_rtype);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&known_names,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&local_unresolved._M_t._M_impl.super__Rb_tree_header);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_unresolved);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &names_by_rtype._M_t._M_impl.super__Rb_tree_header);
    }
  }
  local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header;
  local_unresolved._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __x = &ResourceFinder::getNamesByResourceType_abi_cxx11_(&rf)->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  ::_Rb_tree(&names_by_rtype._M_t,__x);
  for (pbVar12 = to_filter.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar12 !=
      to_filter.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
             ::operator[](&names_by_rtype,pbVar12);
    for (p_Var10 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      p_Var2 = p_Var10 + 1;
      sVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&known_names,(key_type *)p_Var2);
      if (sVar9 == 0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)unresolved,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var2);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_unresolved,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var2);
      }
    }
  }
  if (local_unresolved._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_001a7993:
    pQVar3 = rdicts.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = rdicts.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_01 != pQVar3;
        this_01 = this_01 + 1) {
      QPDFObjectHandle::getKeys_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f0,this_01);
      for (p_Var10 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &local_f0._M_impl.super__Rb_tree_header;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        p_Var2 = p_Var10 + 1;
        if (bVar4) {
LAB_001a79f9:
          this_00 = ResourceFinder::getNames_abi_cxx11_(&rf);
          sVar9 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(this_00,(key_type *)p_Var2);
          if (sVar9 == 0) {
            QPDFObjectHandle::removeKey(this_01,(string *)p_Var2);
          }
        }
        else {
          sVar9 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(unresolved,(key_type *)p_Var2);
          if (sVar9 == 0) goto LAB_001a79f9;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_f0);
    }
    bVar4 = true;
  }
  else {
    bVar5 = QPDFObjectHandle::isDictionary(&resources);
    if (!bVar5) goto LAB_001a7993;
    bVar4 = false;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  ::~_Rb_tree(&names_by_rtype._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_unresolved._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&to_filter);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&known_names._M_t);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&rdicts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&resources.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001a7a81:
  ResourceFinder::~ResourceFinder(&rf);
  return bVar4;
}

Assistant:

bool
QPDFPageObjectHelper::removeUnreferencedResourcesHelper(
    QPDFPageObjectHelper ph, std::set<std::string>& unresolved)
{
    bool is_page = (!ph.oh().isFormXObject());
    if (!is_page) {
        QTC::TC("qpdf", "QPDFPageObjectHelper filter form xobject");
    }

    ResourceFinder rf;
    try {
        auto q = ph.oh().getOwningQPDF();
        size_t before_nw = (q ? q->numWarnings() : 0);
        ph.parseContents(&rf);
        size_t after_nw = (q ? q->numWarnings() : 0);
        if (after_nw > before_nw) {
            ph.oh().warnIfPossible(
                "Bad token found while scanning content stream; "
                "not attempting to remove unreferenced objects from this object");
            return false;
        }
    } catch (std::exception& e) {
        QTC::TC("qpdf", "QPDFPageObjectHelper bad token finding names");
        ph.oh().warnIfPossible(
            std::string("Unable to parse content stream: ") + e.what() +
            "; not attempting to remove unreferenced objects from this object");
        return false;
    }

    // We will walk through /Font and /XObject dictionaries, removing any resources that are not
    // referenced. We must make copies of resource dictionaries down into the dictionaries are
    // mutating to prevent mutating one dictionary from having the side effect of mutating the one
    // it was copied from.
    QPDFObjectHandle resources = ph.getAttribute("/Resources", true);
    std::vector<QPDFObjectHandle> rdicts;
    std::set<std::string> known_names;
    std::vector<std::string> to_filter = {"/Font", "/XObject"};
    if (resources.isDictionary()) {
        for (auto const& iter: to_filter) {
            QPDFObjectHandle dict = resources.getKey(iter);
            if (dict.isDictionary()) {
                dict = resources.replaceKeyAndGetNew(iter, dict.shallowCopy());
                rdicts.push_back(dict);
                auto keys = dict.getKeys();
                known_names.insert(keys.begin(), keys.end());
            }
        }
    }

    std::set<std::string> local_unresolved;
    auto names_by_rtype = rf.getNamesByResourceType();
    for (auto const& i1: to_filter) {
        for (auto const& n_iter: names_by_rtype[i1]) {
            std::string const& name = n_iter.first;
            if (!known_names.count(name)) {
                unresolved.insert(name);
                local_unresolved.insert(name);
            }
        }
    }
    // Older versions of the PDF spec allowed form XObjects to omit their resources dictionaries, in
    // which case names were resolved from the containing page. This behavior seems to be widely
    // supported by viewers. If a form XObjects has a resources dictionary and has some unresolved
    // names, some viewers fail to resolve them, and others allow them to be inherited from the page
    // or from another form XObjects that contains them. Since this behavior is inconsistent across
    // viewers, we consider an unresolved name when a resources dictionary is present to be reason
    // not to remove unreferenced resources. An unresolved name in the absence of a resource
    // dictionary is not considered a problem. For form XObjects, we just accumulate a list of
    // unresolved names, and for page objects, we avoid removing any such names found in nested form
    // XObjects.

    if ((!local_unresolved.empty()) && resources.isDictionary()) {
        // It's not worth issuing a warning for this case. From qpdf 10.3, we are hopefully only
        // looking at names that are referencing fonts and XObjects, but until we're certain that we
        // know the meaning of every name in a content stream, we don't want to give warnings that
        // might be false positives. Also, this can happen in legitimate cases with older PDFs, and
        // there's nothing to be done about it, so there's no good reason to issue a warning. The
        // only sad thing is that it was a false positive that alerted me to a logic error in the
        // code, and any future such errors would now be hidden.
        QTC::TC("qpdf", "QPDFPageObjectHelper unresolved names");
        return false;
    }

    for (auto& dict: rdicts) {
        for (auto const& key: dict.getKeys()) {
            if (is_page && unresolved.count(key)) {
                // This name is referenced by some nested form xobject, so don't remove it.
                QTC::TC("qpdf", "QPDFPageObjectHelper resolving unresolved");
            } else if (!rf.getNames().count(key)) {
                dict.removeKey(key);
            }
        }
    }
    return true;
}